

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QCalendarWidgetPrivate::showMonth(QCalendarWidgetPrivate *this,int year,int month)

{
  QCalendarModel *this_00;
  QCalendarWidget *this_01;
  
  this_00 = this->m_model;
  if ((this_00->m_shownYear == year) && (this_00->m_shownMonth == month)) {
    return;
  }
  this_01 = *(QCalendarWidget **)&(this->super_QWidgetPrivate).field_0x8;
  QtPrivate::QCalendarModel::showMonth(this_00,year,month);
  updateNavigationBar(this);
  QCalendarWidget::currentPageChanged(this_01,year,month);
  (**(code **)(*(long *)&(this->m_view->super_QTableView).super_QAbstractItemView.
                         super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x268))();
  (this->cachedSizeHint).wd = -1;
  (this->cachedSizeHint).ht = -1;
  update(this);
  updateMonthMenu(this);
  return;
}

Assistant:

void QCalendarWidgetPrivate::showMonth(int year, int month)
{
    if (m_model->m_shownYear == year && m_model->m_shownMonth == month)
        return;
    Q_Q(QCalendarWidget);
    m_model->showMonth(year, month);
    updateNavigationBar();
    emit q->currentPageChanged(year, month);
    m_view->internalUpdate();
    cachedSizeHint = QSize();
    update();
    updateMonthMenu();
}